

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegStatePtr pxVar2;
  bool bVar3;
  xmlRegTrans *pxVar4;
  xmlRegStatePtr pxStack_38;
  int newto_1;
  xmlRegStatePtr target;
  xmlRegTransPtr trans;
  int newto;
  int has_epsilon;
  xmlRegStatePtr state;
  int transnr;
  int statenr;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (ctxt->states != (xmlRegStatePtr *)0x0) {
    xmlFAEliminateSimpleEpsilonTransitions(ctxt);
    for (state._4_4_ = 0; state._4_4_ < ctxt->nbStates; state._4_4_ = state._4_4_ + 1) {
      pxVar2 = ctxt->states[state._4_4_];
      if ((pxVar2 != (xmlRegStatePtr)0x0) && (pxVar2->type == XML_REGEXP_UNREACH_STATE)) {
        xmlRegFreeState(pxVar2);
        ctxt->states[state._4_4_] = (xmlRegStatePtr)0x0;
      }
    }
    bVar3 = false;
    state._4_4_ = ctxt->nbStates;
    while (state._4_4_ = state._4_4_ + -1, -1 < state._4_4_) {
      pxVar2 = ctxt->states[state._4_4_];
      if (pxVar2 != (xmlRegStatePtr)0x0) {
        if ((pxVar2->nbTrans == 0) && (pxVar2->type != XML_REGEXP_FINAL_STATE)) {
          pxVar2->type = XML_REGEXP_SINK_STATE;
        }
        for (state._0_4_ = 0; (int)state < pxVar2->nbTrans; state._0_4_ = (int)state + 1) {
          if ((pxVar2->trans[(int)state].atom == (xmlRegAtomPtr)0x0) &&
             (-1 < pxVar2->trans[(int)state].to)) {
            if (pxVar2->trans[(int)state].to == state._4_4_) {
              pxVar2->trans[(int)state].to = -1;
            }
            else if (pxVar2->trans[(int)state].count < 0) {
              iVar1 = pxVar2->trans[(int)state].to;
              bVar3 = true;
              pxVar2->trans[(int)state].to = -2;
              pxVar2->mark = XML_REGEXP_MARK_START;
              xmlFAReduceEpsilonTransitions
                        (ctxt,state._4_4_,iVar1,pxVar2->trans[(int)state].counter);
              xmlFAFinishReduceEpsilonTransitions(ctxt,iVar1);
              pxVar2->mark = XML_REGEXP_MARK_NORMAL;
            }
          }
        }
      }
    }
    if (bVar3) {
      for (state._4_4_ = 0; state._4_4_ < ctxt->nbStates; state._4_4_ = state._4_4_ + 1) {
        pxVar2 = ctxt->states[state._4_4_];
        if (pxVar2 != (xmlRegStatePtr)0x0) {
          for (state._0_4_ = 0; (int)state < pxVar2->nbTrans; state._0_4_ = (int)state + 1) {
            pxVar4 = pxVar2->trans + (int)state;
            if (((pxVar4->atom == (xmlRegAtomPtr)0x0) && (pxVar4->count < 0)) && (-1 < pxVar4->to))
            {
              pxVar4->to = -1;
            }
          }
        }
      }
    }
    for (state._4_4_ = 0; state._4_4_ < ctxt->nbStates; state._4_4_ = state._4_4_ + 1) {
      if (ctxt->states[state._4_4_] != (xmlRegStatePtr)0x0) {
        ctxt->states[state._4_4_]->reached = XML_REGEXP_MARK_NORMAL;
      }
    }
    _newto = *ctxt->states;
    if (_newto != (xmlRegStatePtr)0x0) {
      _newto->reached = XML_REGEXP_MARK_START;
    }
    while (_newto != (xmlRegStatePtr)0x0) {
      pxStack_38 = (xmlRegStatePtr)0x0;
      _newto->reached = XML_REGEXP_MARK_VISITED;
      for (state._0_4_ = 0; (int)state < _newto->nbTrans; state._0_4_ = (int)state + 1) {
        if ((((-1 < _newto->trans[(int)state].to) &&
             ((_newto->trans[(int)state].atom != (xmlRegAtomPtr)0x0 ||
              (-1 < _newto->trans[(int)state].count)))) &&
            (iVar1 = _newto->trans[(int)state].to, ctxt->states[iVar1] != (xmlRegStatePtr)0x0)) &&
           (ctxt->states[iVar1]->reached == XML_REGEXP_MARK_NORMAL)) {
          ctxt->states[iVar1]->reached = XML_REGEXP_MARK_START;
          pxStack_38 = ctxt->states[iVar1];
        }
      }
      pxVar2 = pxStack_38;
      if (pxStack_38 == (xmlRegStatePtr)0x0) {
        state._4_4_ = 1;
        while ((pxVar2 = pxStack_38, state._4_4_ < ctxt->nbStates &&
               ((pxVar2 = ctxt->states[state._4_4_], pxVar2 == (xmlRegStatePtr)0x0 ||
                (pxVar2->reached != XML_REGEXP_MARK_START))))) {
          state._4_4_ = state._4_4_ + 1;
        }
      }
      pxStack_38 = pxVar2;
      _newto = pxStack_38;
    }
    for (state._4_4_ = 0; state._4_4_ < ctxt->nbStates; state._4_4_ = state._4_4_ + 1) {
      pxVar2 = ctxt->states[state._4_4_];
      if ((pxVar2 != (xmlRegStatePtr)0x0) && (pxVar2->reached == XML_REGEXP_MARK_NORMAL)) {
        xmlRegFreeState(pxVar2);
        ctxt->states[state._4_4_] = (xmlRegStatePtr)0x0;
      }
    }
  }
  return;
}

Assistant:

static void
xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    int has_epsilon;

    if (ctxt->states == NULL) return;

    /*
     * Eliminate simple epsilon transition and the associated unreachable
     * states.
     */
    xmlFAEliminateSimpleEpsilonTransitions(ctxt);
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->type == XML_REGEXP_UNREACH_STATE)) {
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

    has_epsilon = 0;

    /*
     * Build the completed transitions bypassing the epsilons
     * Use a marking algorithm to avoid loops
     * Mark sink states too.
     * Process from the latest states backward to the start when
     * there is long cascading epsilon chains this minimize the
     * recursions and transition compares when adding the new ones
     */
    for (statenr = ctxt->nbStates - 1;statenr >= 0;statenr--) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if ((state->nbTrans == 0) &&
	    (state->type != XML_REGEXP_FINAL_STATE)) {
	    state->type = XML_REGEXP_SINK_STATE;
	}
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].atom == NULL) &&
		(state->trans[transnr].to >= 0)) {
		if (state->trans[transnr].to == statenr) {
		    state->trans[transnr].to = -1;
		} else if (state->trans[transnr].count < 0) {
		    int newto = state->trans[transnr].to;

		    has_epsilon = 1;
		    state->trans[transnr].to = -2;
		    state->mark = XML_REGEXP_MARK_START;
		    xmlFAReduceEpsilonTransitions(ctxt, statenr,
				      newto, state->trans[transnr].counter);
		    xmlFAFinishReduceEpsilonTransitions(ctxt, newto);
		    state->mark = XML_REGEXP_MARK_NORMAL;
	        }
	    }
	}
    }
    /*
     * Eliminate the epsilon transitions
     */
    if (has_epsilon) {
	for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	    state = ctxt->states[statenr];
	    if (state == NULL)
		continue;
	    for (transnr = 0;transnr < state->nbTrans;transnr++) {
		xmlRegTransPtr trans = &(state->trans[transnr]);
		if ((trans->atom == NULL) &&
		    (trans->count < 0) &&
		    (trans->to >= 0)) {
		    trans->to = -1;
		}
	    }
	}
    }

    /*
     * Use this pass to detect unreachable states too
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state != NULL)
	    state->reached = XML_REGEXP_MARK_NORMAL;
    }
    state = ctxt->states[0];
    if (state != NULL)
	state->reached = XML_REGEXP_MARK_START;
    while (state != NULL) {
	xmlRegStatePtr target = NULL;
	state->reached = XML_REGEXP_MARK_VISITED;
	/*
	 * Mark all states reachable from the current reachable state
	 */
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].to >= 0) &&
		((state->trans[transnr].atom != NULL) ||
		 (state->trans[transnr].count >= 0))) {
		int newto = state->trans[transnr].to;

		if (ctxt->states[newto] == NULL)
		    continue;
		if (ctxt->states[newto]->reached == XML_REGEXP_MARK_NORMAL) {
		    ctxt->states[newto]->reached = XML_REGEXP_MARK_START;
		    target = ctxt->states[newto];
		}
	    }
	}

	/*
	 * find the next accessible state not explored
	 */
	if (target == NULL) {
	    for (statenr = 1;statenr < ctxt->nbStates;statenr++) {
		state = ctxt->states[statenr];
		if ((state != NULL) && (state->reached ==
			XML_REGEXP_MARK_START)) {
		    target = state;
		    break;
		}
	    }
	}
	state = target;
    }
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->reached == XML_REGEXP_MARK_NORMAL)) {
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

}